

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# left_objects_detector.cpp
# Opt level: O0

void __thiscall
feintrack::SimpleLeftObjectsDetector::AnalyzeShadyLeftObjects(SimpleLeftObjectsDetector *this)

{
  bool bVar1;
  pointer pCVar2;
  const_iterator local_30;
  _List_node_base *local_28;
  _Self local_20;
  _Self local_18;
  iterator iter;
  SimpleLeftObjectsDetector *this_local;
  
  iter._M_node = (_List_node_base *)this;
  local_18._M_node =
       (_List_node_base *)
       std::__cxx11::list<feintrack::CShadyLeftObj,_std::allocator<feintrack::CShadyLeftObj>_>::
       begin(&this->shady_left_objects);
  while( true ) {
    local_20._M_node =
         (_List_node_base *)
         std::__cxx11::list<feintrack::CShadyLeftObj,_std::allocator<feintrack::CShadyLeftObj>_>::
         end(&this->shady_left_objects);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    pCVar2 = std::_List_iterator<feintrack::CShadyLeftObj>::operator->(&local_18);
    if ((pCVar2->super_CLeftObjView).obj_uid == 0) {
      pCVar2 = std::_List_iterator<feintrack::CShadyLeftObj>::operator->(&local_18);
      pCVar2->not_detect_time = pCVar2->not_detect_time + 1;
      pCVar2 = std::_List_iterator<feintrack::CShadyLeftObj>::operator->(&local_18);
      if (this->left_object_time1 < pCVar2->not_detect_time) {
        std::_List_const_iterator<feintrack::CShadyLeftObj>::_List_const_iterator
                  (&local_30,&local_18);
        local_28 = (_List_node_base *)
                   std::__cxx11::
                   list<feintrack::CShadyLeftObj,_std::allocator<feintrack::CShadyLeftObj>_>::erase
                             (&this->shady_left_objects,local_30);
        local_18._M_node = local_28;
      }
      else {
        std::_List_iterator<feintrack::CShadyLeftObj>::operator++(&local_18);
      }
    }
    else {
      std::_List_iterator<feintrack::CShadyLeftObj>::operator++(&local_18);
    }
  }
  return;
}

Assistant:

void SimpleLeftObjectsDetector::AnalyzeShadyLeftObjects()
{
    for (auto iter = shady_left_objects.begin(); iter != shady_left_objects.end();)
    {
        if (!iter->obj_uid)
        {
            iter->not_detect_time++;
            if (iter->not_detect_time > left_object_time1)
                iter = shady_left_objects.erase(iter);
            else
                ++iter;
        }
        else
        {
            ++iter;
        }
    }
}